

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ReverseLayerParams::~ReverseLayerParams(ReverseLayerParams *this)

{
  ~ReverseLayerParams(this);
  operator_delete(this,0x28);
  return;
}

Assistant:

ReverseLayerParams::~ReverseLayerParams() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.ReverseLayerParams)
  SharedDtor();
}